

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_builder.h
# Opt level: O3

Fantasy_Character_union_ref_t
Fantasy_Character_clone(flatbuffers_builder_t *B,Fantasy_Character_union_t u)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  undefined2 *puVar5;
  int *piVar6;
  Fantasy_Character_union_ref_t FVar7;
  int *s;
  size_t sVar8;
  ulong uVar9;
  Fantasy_Character_union_ref_t FVar10;
  
  s = (int *)u.value;
  uVar3 = u._0_4_ & 0xff;
  FVar10.type = '\0';
  FVar10._1_3_ = 0;
  FVar10.value = 0;
  switch(uVar3) {
  case 2:
    break;
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    goto switchD_00112642_caseD_3;
  case 8:
    if (B->refmap != (flatcc_refmap_t *)0x0) {
      uVar3 = flatcc_refmap_find(B->refmap,s);
      uVar9 = (ulong)uVar3;
      if (uVar3 != 0) goto LAB_001128fc;
    }
    puVar5 = (undefined2 *)flatcc_builder_start_struct(B,8,4);
    if (puVar5 == (undefined2 *)0x0) {
      uVar9 = 0;
    }
    else {
      *puVar5 = (short)*s;
      *(undefined1 *)(puVar5 + 2) = 0;
      uVar3 = flatcc_builder_end_struct(B);
      uVar9 = (ulong)uVar3;
      if (B->refmap != (flatcc_refmap_t *)0x0) {
        uVar3 = flatcc_refmap_insert(B->refmap,s,uVar3);
        uVar9 = (ulong)uVar3;
      }
    }
LAB_001128fc:
    return (Fantasy_Character_union_ref_t)(uVar9 << 0x20 | 8);
  case 9:
    if (B->refmap != (flatcc_refmap_t *)0x0) {
      uVar3 = flatcc_refmap_find(B->refmap,s);
      uVar9 = (ulong)uVar3;
      if (uVar3 != 0) goto LAB_001128ef;
    }
    piVar6 = (int *)flatcc_builder_start_struct(B,4,4);
    if (piVar6 == (int *)0x0) {
      uVar9 = 0;
    }
    else {
      *piVar6 = *s;
      uVar3 = flatcc_builder_end_struct(B);
      uVar9 = (ulong)uVar3;
      if (B->refmap != (flatcc_refmap_t *)0x0) {
        uVar3 = flatcc_refmap_insert(B->refmap,s,uVar3);
        uVar9 = (ulong)uVar3;
      }
    }
LAB_001128ef:
    return (Fantasy_Character_union_ref_t)(uVar9 << 0x20 | 9);
  case 10:
    if (B->refmap != (flatcc_refmap_t *)0x0) {
      uVar3 = flatcc_refmap_find(B->refmap,s);
      uVar9 = (ulong)uVar3;
      if (uVar3 != 0) goto LAB_00112909;
    }
    piVar6 = (int *)flatcc_builder_start_struct(B,4,4);
    if (piVar6 == (int *)0x0) {
      uVar9 = 0;
    }
    else {
      *piVar6 = *s;
      uVar3 = flatcc_builder_end_struct(B);
      uVar9 = (ulong)uVar3;
      if (B->refmap != (flatcc_refmap_t *)0x0) {
        uVar3 = flatcc_refmap_insert(B->refmap,s,uVar3);
        uVar9 = (ulong)uVar3;
      }
    }
LAB_00112909:
    return (Fantasy_Character_union_ref_t)(uVar9 << 0x20 | 10);
  case 0xb:
    if (B->refmap != (flatcc_refmap_t *)0x0) {
      uVar3 = flatcc_refmap_find(B->refmap,s);
      uVar9 = (ulong)uVar3;
      if (uVar3 != 0) goto LAB_001128e2;
    }
    if (s == (int *)0x0) {
      sVar8 = 0;
    }
    else {
      sVar8 = (size_t)(uint)s[-1];
    }
    uVar3 = flatcc_builder_create_string(B,(char *)s,sVar8);
    uVar9 = (ulong)uVar3;
    if (B->refmap != (flatcc_refmap_t *)0x0) {
      uVar3 = flatcc_refmap_insert(B->refmap,s,uVar3);
      uVar9 = (ulong)uVar3;
    }
LAB_001128e2:
    return (Fantasy_Character_union_ref_t)(uVar9 << 0x20 | 0xb);
  default:
    if (uVar3 != 0xff) {
      FVar7.type = '\0';
      FVar7._1_3_ = 0;
      FVar7.value = 0;
      return FVar7;
    }
    if (B->refmap == (flatcc_refmap_t *)0x0) {
LAB_00112738:
      if (s == (int *)0x0) {
        sVar8 = 0;
      }
      else {
        sVar8 = (size_t)(uint)s[-1];
      }
      uVar3 = flatcc_builder_create_string(B,(char *)s,sVar8);
      uVar9 = (ulong)uVar3;
      if (B->refmap != (flatcc_refmap_t *)0x0) {
        uVar3 = flatcc_refmap_insert(B->refmap,s,uVar3);
        uVar9 = (ulong)uVar3;
      }
    }
    else {
      uVar3 = flatcc_refmap_find(B->refmap,s);
      uVar9 = (ulong)uVar3;
      if (uVar3 == 0) goto LAB_00112738;
    }
    FVar10 = (Fantasy_Character_union_ref_t)(uVar9 << 0x20 | 0xff);
    goto switchD_00112642_caseD_3;
  }
  if (B->refmap == (flatcc_refmap_t *)0x0) {
LAB_00112663:
    iVar2 = flatcc_builder_start_table(B,1);
    uVar9 = 0;
    if (iVar2 == 0) {
      if (s == (int *)0x0) {
        __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_reader.h"
                      ,0x487,
                      "const int32_t *Fantasy_Attacker_sword_attack_damage_get_ptr(Fantasy_Attacker_table_t)"
                     );
      }
      if ((5 < *(ushort *)((long)s - (long)*s)) &&
         (uVar1 = *(ushort *)((long)s + (4 - (long)*s)), uVar1 != 0)) {
        uVar9 = 0;
        pvVar4 = flatcc_builder_table_add_copy(B,0,(void *)((ulong)uVar1 + (long)s),4,4);
        if (pvVar4 == (void *)0x0) goto LAB_00112701;
      }
      iVar2 = flatcc_builder_check_required(B,__Fantasy_Attacker_required,0);
      if (iVar2 == 0) {
        __assert_fail("flatcc_builder_check_required(B, __Fantasy_Attacker_required, sizeof(__Fantasy_Attacker_required) / sizeof(__Fantasy_Attacker_required[0]) - 1)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/test/monster_test/generated/monster_test_builder.h"
                      ,0x153,"Fantasy_Attacker_ref_t Fantasy_Attacker_end(flatbuffers_builder_t *)")
        ;
      }
      uVar3 = flatcc_builder_end_table(B);
      uVar9 = (ulong)uVar3;
      if (B->refmap != (flatcc_refmap_t *)0x0) {
        uVar3 = flatcc_refmap_insert(B->refmap,s,uVar3);
        uVar9 = (ulong)uVar3;
      }
    }
  }
  else {
    uVar3 = flatcc_refmap_find(B->refmap,s);
    uVar9 = (ulong)uVar3;
    if (uVar3 == 0) goto LAB_00112663;
  }
LAB_00112701:
  FVar10 = (Fantasy_Character_union_ref_t)(uVar9 << 0x20 | 2);
switchD_00112642_caseD_3:
  return FVar10;
}

Assistant:

static Fantasy_Character_union_ref_t Fantasy_Character_clone(flatbuffers_builder_t *B, Fantasy_Character_union_t u)
{
    switch (u.type) {
    case 2: return Fantasy_Character_as_MuLan(Fantasy_Attacker_clone(B, (Fantasy_Attacker_table_t)u.value));
    case 8: return Fantasy_Character_as_Rapunzel(Fantasy_Rapunzel_clone(B, (Fantasy_Rapunzel_struct_t)u.value));
    case 9: return Fantasy_Character_as_Belle(Fantasy_BookReader_clone(B, (Fantasy_BookReader_struct_t)u.value));
    case 10: return Fantasy_Character_as_BookFan(Fantasy_BookReader_clone(B, (Fantasy_BookReader_struct_t)u.value));
    case 11: return Fantasy_Character_as_Other(flatbuffers_string_clone(B, u.value));
    case 255: return Fantasy_Character_as_Unused(flatbuffers_string_clone(B, u.value));
    default: return Fantasy_Character_as_NONE();
    }
}